

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall
re2::Prog::SearchDFA
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match0,bool *failed,SparseSet *matches)

{
  undefined1 uVar1;
  char *pcVar2;
  const_pointer pcVar3;
  bool bVar4;
  DFA *this_00;
  size_type sVar5;
  StringPiece *pSVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  StringPiece context;
  char *ep;
  StringPiece *local_38;
  
  *failed = false;
  context.data_ = const_context->data_;
  context.size_ = const_context->size_;
  if (context.data_ == (const_pointer)0x0) {
    context.data_ = text->data_;
    context.size_ = text->size_;
  }
  uVar1 = this->anchor_start_;
  bVar9 = this->anchor_end_;
  bVar7 = uVar1;
  bVar8 = bVar9;
  if (this->reversed_ != false) {
    bVar7 = bVar9;
    bVar8 = uVar1;
  }
  if (((bVar7 == 1) && (context.data_ != text->data_)) ||
     ((bVar8 != 0 && (context.data_ + context.size_ != text->data_ + text->size_)))) {
    bVar9 = false;
  }
  else {
    bVar8 = true;
    if (anchor != kAnchored) {
      bVar8 = kind == kFullMatch | uVar1;
    }
    if ((kind == kFullMatch) || ((kind != kManyMatch && (bVar9 != false)))) {
      kind = kLongestMatch;
      bVar7 = 1;
    }
    else {
      bVar7 = 0;
    }
    if (kind == kManyMatch) {
      bVar9 = matches == (SparseSet *)0x0;
      kind = kManyMatch;
    }
    else if (match0 == (StringPiece *)0x0) {
      bVar9 = (bool)(bVar7 ^ 1);
      if (bVar7 == 0) {
        kind = kLongestMatch;
      }
    }
    else {
      bVar9 = false;
    }
    local_38 = match0;
    this_00 = GetDFA(this,kind);
    bVar4 = DFA::Search(this_00,text,&context,(bool)bVar8,bVar9,(bool)(this->reversed_ ^ 1),failed,
                        &ep,matches);
    bVar9 = false;
    if ((bVar4) && (bVar9 = false, *failed == false)) {
      if (bVar7 != 0) {
        if (this->reversed_ == false) {
          sVar5 = text->size_;
        }
        else {
          sVar5 = 0;
        }
        if (ep != text->data_ + sVar5) {
          return false;
        }
      }
      bVar9 = true;
      if (local_38 != (StringPiece *)0x0) {
        pSVar6 = (StringPiece *)&ep;
        pcVar3 = text->data_ + text->size_;
        if (this->reversed_ == false) {
          pSVar6 = text;
          pcVar3 = ep;
        }
        pcVar2 = pSVar6->data_;
        local_38->data_ = pcVar2;
        local_38->size_ = (long)pcVar3 - (long)pcVar2;
      }
    }
  }
  return bVar9;
}

Assistant:

bool Prog::SearchDFA(const StringPiece& text, const StringPiece& const_context,
                     Anchor anchor, MatchKind kind, StringPiece* match0,
                     bool* failed, SparseSet* matches) {
  *failed = false;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;
  bool carat = anchor_start();
  bool dollar = anchor_end();
  if (reversed_) {
    using std::swap;
    swap(carat, dollar);
  }
  if (carat && context.begin() != text.begin())
    return false;
  if (dollar && context.end() != text.end())
    return false;

  // Handle full match by running an anchored longest match
  // and then checking if it covers all of text.
  bool anchored = anchor == kAnchored || anchor_start() || kind == kFullMatch;
  bool endmatch = false;
  if (kind == kManyMatch) {
    // This is split out in order to avoid clobbering kind.
  } else if (kind == kFullMatch || anchor_end()) {
    endmatch = true;
    kind = kLongestMatch;
  }

  // If the caller doesn't care where the match is (just whether one exists),
  // then we can stop at the very first match we find, the so-called
  // "earliest match".
  bool want_earliest_match = false;
  if (kind == kManyMatch) {
    // This is split out in order to avoid clobbering kind.
    if (matches == NULL) {
      want_earliest_match = true;
    }
  } else if (match0 == NULL && !endmatch) {
    want_earliest_match = true;
    kind = kLongestMatch;
  }

  DFA* dfa = GetDFA(kind);
  const char* ep;
  bool matched = dfa->Search(text, context, anchored,
                             want_earliest_match, !reversed_,
                             failed, &ep, matches);
  if (*failed)
    return false;
  if (!matched)
    return false;
  if (endmatch && ep != (reversed_ ? text.data() : text.data() + text.size()))
    return false;

  // If caller cares, record the boundary of the match.
  // We only know where it ends, so use the boundary of text
  // as the beginning.
  if (match0) {
    if (reversed_)
      *match0 =
          StringPiece(ep, static_cast<size_t>(text.data() + text.size() - ep));
    else
      *match0 =
          StringPiece(text.data(), static_cast<size_t>(ep - text.data()));
  }
  return true;
}